

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

int makebkfile(int f,int n)

{
  bool bVar1;
  char *pcVar2;
  int n_local;
  int f_local;
  
  if ((f & 7U) == 0) {
    bVar1 = (bool)((makebackup != 0 ^ 0xffU) & 1);
  }
  else {
    bVar1 = 0 < n;
  }
  makebackup = (int)bVar1;
  pcVar2 = "dis";
  if (makebackup != 0) {
    pcVar2 = "en";
  }
  ewprintf("Backup files %sabled",pcVar2);
  return 1;
}

Assistant:

int
makebkfile(int f, int n)
{
	if (f & FFARG)
		makebackup = n > 0;
	else
		makebackup = !makebackup;
	ewprintf("Backup files %sabled", makebackup ? "en" : "dis");
	return (TRUE);
}